

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_4x4(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  JSAMPLE *pJVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  JSAMPROW pJVar8;
  long lVar9;
  JSAMPLE local_d8 [4];
  int local_d4;
  int workspace [16];
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  INT32 z3;
  INT32 z2;
  INT32 z1;
  INT32 tmp12;
  INT32 tmp10;
  INT32 tmp2;
  INT32 tmp0;
  JDIMENSION output_col_local;
  JSAMPARRAY output_buf_local;
  JCOEFPTR coef_block_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  pJVar1 = cinfo->sample_range_limit;
  wsptr = (int *)compptr->dct_table;
  outptr = local_d8;
  quantptr = (ISLOW_MULT_TYPE *)coef_block;
  for (workspace[0xf] = 0; workspace[0xf] < 4; workspace[0xf] = workspace[0xf] + 1) {
    iVar2 = (int)(short)*quantptr * *wsptr;
    iVar3 = (int)(short)quantptr[8] * wsptr[0x10];
    iVar4 = (iVar2 + iVar3) * 4;
    iVar3 = (iVar2 - iVar3) * 4;
    lVar5 = (long)((int)(short)quantptr[4] * wsptr[8]);
    lVar6 = (long)((int)(short)quantptr[0xc] * wsptr[0x18]);
    lVar7 = (lVar5 + lVar6) * 0x1151 + 0x400;
    iVar2 = (int)(lVar7 + lVar5 * 0x187e >> 0xb);
    *(int *)outptr = iVar4 + iVar2;
    *(int *)(outptr + 0x30) = iVar4 - iVar2;
    iVar2 = (int)(lVar7 + lVar6 * -0x3b21 >> 0xb);
    *(int *)(outptr + 0x10) = iVar3 + iVar2;
    *(int *)(outptr + 0x20) = iVar3 - iVar2;
    quantptr = (ISLOW_MULT_TYPE *)((long)quantptr + 2);
    wsptr = wsptr + 1;
    outptr = outptr + 4;
  }
  outptr = local_d8;
  for (workspace[0xf] = 0; workspace[0xf] < 4; workspace[0xf] = workspace[0xf] + 1) {
    pJVar8 = output_buf[workspace[0xf]] + output_col;
    lVar5 = ((long)*(int *)outptr + 0x10 + (long)*(int *)(outptr + 8)) * 0x2000;
    lVar6 = (((long)*(int *)outptr + 0x10) - (long)*(int *)(outptr + 8)) * 0x2000;
    lVar9 = ((long)*(int *)(outptr + 4) + (long)*(int *)(outptr + 0xc)) * 0x1151;
    lVar7 = lVar9 + (long)*(int *)(outptr + 4) * 0x187e;
    lVar9 = lVar9 + (long)*(int *)(outptr + 0xc) * -0x3b21;
    *pJVar8 = pJVar1[(long)(int)((uint)(lVar5 + lVar7 >> 0x12) & 0x3ff) + 0x80];
    pJVar8[3] = pJVar1[(long)(int)((uint)(lVar5 - lVar7 >> 0x12) & 0x3ff) + 0x80];
    pJVar8[1] = pJVar1[(long)(int)((uint)(lVar6 + lVar9 >> 0x12) & 0x3ff) + 0x80];
    pJVar8[2] = pJVar1[(long)(int)((uint)(lVar6 - lVar9 >> 0x12) & 0x3ff) + 0x80];
    outptr = outptr + 0x10;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_4x4 (j_decompress_ptr cinfo, jpeg_component_info * compptr,
	       JCOEFPTR coef_block,
	       JSAMPARRAY output_buf, JDIMENSION output_col)
{
  INT32 tmp0, tmp2, tmp10, tmp12;
  INT32 z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[4*4];	/* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 4; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    
    tmp10 = (tmp0 + tmp2) << PASS1_BITS;
    tmp12 = (tmp0 - tmp2) << PASS1_BITS;

    /* Odd part */
    /* Same rotation as in the even part of the 8x8 LL&M IDCT */

    z2 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    z3 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);               /* c6 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-1);
    tmp0 = RIGHT_SHIFT(z1 + MULTIPLY(z2, FIX_0_765366865), /* c2-c6 */
		       CONST_BITS-PASS1_BITS);
    tmp2 = RIGHT_SHIFT(z1 - MULTIPLY(z3, FIX_1_847759065), /* c2+c6 */
		       CONST_BITS-PASS1_BITS);

    /* Final output stage */

    wsptr[4*0] = (int) (tmp10 + tmp0);
    wsptr[4*3] = (int) (tmp10 - tmp0);
    wsptr[4*1] = (int) (tmp12 + tmp2);
    wsptr[4*2] = (int) (tmp12 - tmp2);
  }

  /* Pass 2: process 4 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 4; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (INT32) wsptr[0] + (ONE << (PASS1_BITS+2));
    tmp2 = (INT32) wsptr[2];

    tmp10 = (tmp0 + tmp2) << CONST_BITS;
    tmp12 = (tmp0 - tmp2) << CONST_BITS;

    /* Odd part */
    /* Same rotation as in the even part of the 8x8 LL&M IDCT */

    z2 = (INT32) wsptr[1];
    z3 = (INT32) wsptr[3];

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);   /* c6 */
    tmp0 = z1 + MULTIPLY(z2, FIX_0_765366865); /* c2-c6 */
    tmp2 = z1 - MULTIPLY(z3, FIX_1_847759065); /* c2+c6 */

    /* Final output stage */

    outptr[0] = range_limit[(int) RIGHT_SHIFT(tmp10 + tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[(int) RIGHT_SHIFT(tmp10 - tmp0,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[(int) RIGHT_SHIFT(tmp12 + tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[(int) RIGHT_SHIFT(tmp12 - tmp2,
					      CONST_BITS+PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += 4;		/* advance pointer to next row */
  }
}